

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O2

Expression *
slang::ast::ConditionalExpression::fromSyntax
          (Compilation *comp,ConditionalExpressionSyntax *syntax,ASTContext *context,
          Type *assignmentTarget)

{
  SeparatedSyntaxList<slang::syntax::ConditionalPatternSyntax> *pSVar1;
  char *pcVar2;
  ConditionalPredicateSyntax *pCVar3;
  size_t sVar4;
  Expression *this;
  uint uVar5;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  Compilation *pCVar6;
  TempVarSymbol *pTVar7;
  bool bVar8;
  bool bVar9;
  uint uVar10;
  int iVar11;
  ConditionalPatternSyntax *pCVar12;
  uint64_t hash;
  Diagnostic *pDVar13;
  InvalidPattern *pIVar14;
  undefined4 extraout_var_00;
  variant_alternative_t<1UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *pvVar15;
  undefined7 extraout_var;
  Expression *this_00;
  Type *pTVar16;
  undefined4 extraout_var_01;
  ConditionalExpression *expr;
  ConditionalExpression *pCVar17;
  SourceLocation SVar18;
  Diagnostic *pDVar19;
  pointer ppPVar20;
  bitmask<slang::ast::ASTFlags> bVar21;
  long lVar22;
  ulong uVar23;
  EVP_PKEY_CTX *src;
  byte bVar24;
  undefined7 uVar26;
  Type *pTVar25;
  long lVar27;
  ulong uVar28;
  sockaddr *__addr;
  ConditionalExpression *ctx;
  byte bVar29;
  basic_string_view<char,_std::char_traits<char>_> *__y;
  string_view *sv;
  ASTContext *this_01;
  ulong uVar30;
  Type *this_02;
  undefined1 auVar31 [16];
  char cVar32;
  char cVar33;
  char cVar34;
  char cVar35;
  char cVar36;
  char cVar37;
  byte bVar38;
  char cVar39;
  char cVar40;
  char cVar41;
  byte bVar42;
  char cVar43;
  char cVar44;
  char cVar45;
  byte bVar46;
  string_view arg;
  SourceRange range;
  bool isConst;
  bool isTrue;
  try_emplace_args_t local_269;
  Compilation *local_268;
  Expression *local_260;
  ASTContext *local_258;
  Expression *local_250;
  ulong local_248;
  TempVarSymbol *local_240;
  Token *local_238;
  undefined8 local_230;
  Type *local_228;
  ConditionalExpressionSyntax *local_220;
  iterator __begin2;
  ASTContext trueContext;
  SmallVector<const_slang::ast::PatternVarSymbol_*,_5UL> vars;
  SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*,_4UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_96UL,_16UL>_>
  varMap;
  locator local_a0;
  char local_88;
  char cStack_87;
  char cStack_86;
  byte bStack_85;
  char cStack_84;
  char cStack_83;
  char cStack_82;
  byte bStack_81;
  char cStack_80;
  char cStack_7f;
  char cStack_7e;
  byte bStack_7d;
  char cStack_7c;
  char cStack_7b;
  char cStack_7a;
  byte bStack_79;
  char local_78;
  char cStack_77;
  char cStack_76;
  byte bStack_75;
  char cStack_74;
  char cStack_73;
  char cStack_72;
  byte bStack_71;
  char cStack_70;
  char cStack_6f;
  char cStack_6e;
  byte bStack_6d;
  char cStack_6c;
  char cStack_6b;
  char cStack_6a;
  byte bStack_69;
  SmallVector<slang::ast::ConditionalExpression::Condition,_2UL> conditions;
  
  conditions.super_SmallVectorBase<slang::ast::ConditionalExpression::Condition>.data_ =
       (pointer)conditions.super_SmallVectorBase<slang::ast::ConditionalExpression::Condition>.
                firstElement;
  conditions.super_SmallVectorBase<slang::ast::ConditionalExpression::Condition>.len = 0;
  isConst = true;
  isTrue = true;
  conditions.super_SmallVectorBase<slang::ast::ConditionalExpression::Condition>.cap = 2;
  trueContext.assertionInstance = context->assertionInstance;
  trueContext.scope.ptr = (context->scope).ptr;
  trueContext.lookupIndex = context->lookupIndex;
  trueContext._12_4_ = *(undefined4 *)&context->field_0xc;
  trueContext.flags.m_bits._0_1_ = (undefined1)(context->flags).m_bits;
  trueContext.flags.m_bits._1_1_ = *(undefined1 *)((long)&(context->flags).m_bits + 1);
  trueContext.flags.m_bits._2_1_ = *(undefined1 *)((long)&(context->flags).m_bits + 2);
  trueContext.flags.m_bits._3_1_ = *(undefined1 *)((long)&(context->flags).m_bits + 3);
  trueContext.flags.m_bits._4_1_ = *(undefined1 *)((long)&(context->flags).m_bits + 4);
  trueContext.flags.m_bits._5_1_ = *(undefined1 *)((long)&(context->flags).m_bits + 5);
  trueContext.flags.m_bits._6_1_ = *(undefined1 *)((long)&(context->flags).m_bits + 6);
  trueContext.flags.m_bits._7_1_ = *(undefined1 *)((long)&(context->flags).m_bits + 7);
  trueContext.instanceOrProc._0_1_ = *(undefined1 *)&context->instanceOrProc;
  trueContext.instanceOrProc._1_1_ = *(undefined1 *)((long)&context->instanceOrProc + 1);
  trueContext.instanceOrProc._2_1_ = *(undefined1 *)((long)&context->instanceOrProc + 2);
  trueContext.instanceOrProc._3_1_ = *(undefined1 *)((long)&context->instanceOrProc + 3);
  trueContext.instanceOrProc._4_1_ = *(undefined1 *)((long)&context->instanceOrProc + 4);
  trueContext.instanceOrProc._5_1_ = *(undefined1 *)((long)&context->instanceOrProc + 5);
  trueContext.instanceOrProc._6_1_ = *(undefined1 *)((long)&context->instanceOrProc + 6);
  trueContext.instanceOrProc._7_1_ = *(undefined1 *)((long)&context->instanceOrProc + 7);
  trueContext.firstTempVar = context->firstTempVar;
  trueContext.randomizeDetails = context->randomizeDetails;
  pCVar3 = (syntax->predicate).ptr;
  pSVar1 = &pCVar3->conditions;
  __begin2.index = 0;
  sVar4 = (pCVar3->conditions).elements._M_extent._M_extent_value;
  local_230 = 0;
  uVar23 = 0;
  local_268 = comp;
  local_258 = context;
  local_228 = assignmentTarget;
  local_220 = syntax;
  __begin2.list = pSVar1;
  for (; (pCVar6 = local_268, bVar9 = isTrue, bVar8 = isConst, __begin2.list != pSVar1 ||
         (__begin2.index != sVar4 + 1 >> 1)); __begin2.index = __begin2.index + 1) {
    pCVar12 = slang::syntax::SeparatedSyntaxList<slang::syntax::ConditionalPatternSyntax>::
              iterator_base<slang::syntax::ConditionalPatternSyntax_*>::dereference(&__begin2);
    local_250 = Expression::selfDetermined
                          (local_268,(pCVar12->expr).ptr,&trueContext,
                           (bitmask<slang::ast::ASTFlags>)0x0);
    bVar8 = Expression::bad(local_250);
    uVar26 = (undefined7)(uVar23 >> 8);
    bVar24 = (byte)uVar23 | bVar8;
    uVar23 = CONCAT71(uVar26,bVar24);
    if (pCVar12->matchesClause == (MatchesClauseSyntax *)0x0) {
      bVar8 = Type::isFourState((local_250->type).ptr);
      local_230 = CONCAT71((int7)((ulong)local_230 >> 8),(byte)local_230 | bVar8);
      if (bVar24 == 0) {
        bVar8 = ASTContext::requireBooleanConvertible(&trueContext,local_250);
        uVar23 = CONCAT71(extraout_var,bVar8) & 0xffffffff ^ 1;
        pIVar14 = (InvalidPattern *)0x0;
        goto LAB_003c4e26;
      }
      uVar23 = CONCAT71(uVar26,1);
      pIVar14 = (InvalidPattern *)0x0;
    }
    else {
      __addr = (sockaddr *)(pCVar12->matchesClause->pattern).ptr;
      pTVar25 = (local_250->type).ptr;
      vars.super_SmallVectorBase<const_slang::ast::PatternVarSymbol_*>.len = 0;
      vars.super_SmallVectorBase<const_slang::ast::PatternVarSymbol_*>.data_ =
           (pointer)vars.super_SmallVectorBase<const_slang::ast::PatternVarSymbol_*>.firstElement;
      vars.super_SmallVectorBase<const_slang::ast::PatternVarSymbol_*>.cap = 5;
      bVar8 = Pattern::createPatternVars(&trueContext,(PatternSyntax *)__addr,pTVar25,&vars);
      if (bVar8) {
        SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*,_4UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_96UL,_16UL>_>
        ::SmallMap(&varMap);
        local_238 = (Token *)(vars.super_SmallVectorBase<const_slang::ast::PatternVarSymbol_*>.data_
                             + vars.super_SmallVectorBase<const_slang::ast::PatternVarSymbol_*>.len)
        ;
        ppPVar20 = vars.super_SmallVectorBase<const_slang::ast::PatternVarSymbol_*>.data_;
        local_248 = uVar23;
        while ((Token *)ppPVar20 != local_238) {
          local_240 = &(*ppPVar20)->super_TempVarSymbol;
          local_260 = (Expression *)ppPVar20;
          if ((local_240->super_VariableSymbol).super_ValueSymbol.super_Symbol.name._M_len != 0) {
            sv = &(local_240->super_VariableSymbol).super_ValueSymbol.super_Symbol.name;
            hash = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                             ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                              &varMap.super_Storage.field_0x68,sv);
            uVar30 = hash >> (varMap._112_1_ & 0x3f);
            lVar22 = (hash & 0xff) * 4;
            cVar32 = (&UNK_0043a38c)[lVar22];
            cVar33 = (&UNK_0043a38d)[lVar22];
            cVar34 = (&UNK_0043a38e)[lVar22];
            bVar24 = (&UNK_0043a38f)[lVar22];
            uVar28 = 0;
            uVar23 = uVar30;
            cVar35 = cVar32;
            cVar36 = cVar33;
            cVar37 = cVar34;
            bVar38 = bVar24;
            cVar39 = cVar32;
            cVar40 = cVar33;
            cVar41 = cVar34;
            bVar42 = bVar24;
            cVar43 = cVar32;
            cVar44 = cVar33;
            cVar45 = cVar34;
            bVar46 = bVar24;
            do {
              pcVar2 = (char *)(varMap._128_8_ + uVar23 * 0x10);
              local_78 = *pcVar2;
              cStack_77 = pcVar2[1];
              cStack_76 = pcVar2[2];
              bStack_75 = pcVar2[3];
              cStack_74 = pcVar2[4];
              cStack_73 = pcVar2[5];
              cStack_72 = pcVar2[6];
              bStack_71 = pcVar2[7];
              cStack_70 = pcVar2[8];
              cStack_6f = pcVar2[9];
              cStack_6e = pcVar2[10];
              bStack_6d = pcVar2[0xb];
              cStack_6c = pcVar2[0xc];
              cStack_6b = pcVar2[0xd];
              cStack_6a = pcVar2[0xe];
              bVar29 = pcVar2[0xf];
              auVar31[0] = -(local_78 == cVar32);
              auVar31[1] = -(cStack_77 == cVar33);
              auVar31[2] = -(cStack_76 == cVar34);
              auVar31[3] = -(bStack_75 == bVar24);
              auVar31[4] = -(cStack_74 == cVar35);
              auVar31[5] = -(cStack_73 == cVar36);
              auVar31[6] = -(cStack_72 == cVar37);
              auVar31[7] = -(bStack_71 == bVar38);
              auVar31[8] = -(cStack_70 == cVar39);
              auVar31[9] = -(cStack_6f == cVar40);
              auVar31[10] = -(cStack_6e == cVar41);
              auVar31[0xb] = -(bStack_6d == bVar42);
              auVar31[0xc] = -(cStack_6c == cVar43);
              auVar31[0xd] = -(cStack_6b == cVar44);
              auVar31[0xe] = -(cStack_6a == cVar45);
              auVar31[0xf] = -(bVar29 == bVar46);
              uVar10 = (uint)(ushort)((ushort)(SUB161(auVar31 >> 7,0) & 1) |
                                      (ushort)(SUB161(auVar31 >> 0xf,0) & 1) << 1 |
                                      (ushort)(SUB161(auVar31 >> 0x17,0) & 1) << 2 |
                                      (ushort)(SUB161(auVar31 >> 0x1f,0) & 1) << 3 |
                                      (ushort)(SUB161(auVar31 >> 0x27,0) & 1) << 4 |
                                      (ushort)(SUB161(auVar31 >> 0x2f,0) & 1) << 5 |
                                      (ushort)(SUB161(auVar31 >> 0x37,0) & 1) << 6 |
                                      (ushort)(SUB161(auVar31 >> 0x3f,0) & 1) << 7 |
                                      (ushort)(SUB161(auVar31 >> 0x47,0) & 1) << 8 |
                                      (ushort)(SUB161(auVar31 >> 0x4f,0) & 1) << 9 |
                                      (ushort)(SUB161(auVar31 >> 0x57,0) & 1) << 10 |
                                      (ushort)(SUB161(auVar31 >> 0x5f,0) & 1) << 0xb |
                                      (ushort)(SUB161(auVar31 >> 0x67,0) & 1) << 0xc |
                                      (ushort)(SUB161(auVar31 >> 0x6f,0) & 1) << 0xd |
                                     (ushort)(SUB161(auVar31 >> 0x77,0) & 1) << 0xe);
              bStack_69 = bVar29;
              if (uVar10 != 0) {
                lVar27 = varMap._128_8_ + uVar23 * 0x10;
                lVar22 = varMap._136_8_ + uVar23 * 0x168;
                local_88 = cVar32;
                cStack_87 = cVar33;
                cStack_86 = cVar34;
                bStack_85 = bVar24;
                cStack_84 = cVar35;
                cStack_83 = cVar36;
                cStack_82 = cVar37;
                bStack_81 = bVar38;
                cStack_80 = cVar39;
                cStack_7f = cVar40;
                cStack_7e = cVar41;
                bStack_7d = bVar42;
                cStack_7c = cVar43;
                cStack_7b = cVar44;
                cStack_7a = cVar45;
                bStack_79 = bVar46;
                do {
                  uVar5 = 0;
                  if (uVar10 != 0) {
                    for (; (uVar10 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
                    }
                  }
                  __y = (basic_string_view<char,_std::char_traits<char>_> *)
                        ((ulong)uVar5 * 0x18 + lVar22);
                  bVar8 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                          operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                      *)&varMap.super_Storage.field_0x68,sv,__y);
                  if (bVar8) {
                    pDVar13 = ASTContext::addDiag(&trueContext,(DiagCode)0x2a000a,
                                                  (local_240->super_VariableSymbol).
                                                  super_ValueSymbol.super_Symbol.location);
                    assignmentTarget = local_228;
                    uVar23 = local_248;
                    Diagnostic::operator<<
                              (pDVar13,(local_240->super_VariableSymbol).super_ValueSymbol.
                                       super_Symbol.name);
                    Diagnostic::addNote(pDVar13,(DiagCode)0x50001,
                                        *(SourceLocation *)(__y[1]._M_len + 0x18));
                    goto LAB_003c4d53;
                  }
                  uVar10 = uVar10 - 1 & uVar10;
                } while (uVar10 != 0);
                bVar29 = *(byte *)(lVar27 + 0xf);
                cVar32 = local_88;
                cVar33 = cStack_87;
                cVar34 = cStack_86;
                bVar24 = bStack_85;
                cVar35 = cStack_84;
                cVar36 = cStack_83;
                cVar37 = cStack_82;
                bVar38 = bStack_81;
                cVar39 = cStack_80;
                cVar40 = cStack_7f;
                cVar41 = cStack_7e;
                bVar42 = bStack_7d;
                cVar43 = cStack_7c;
                cVar44 = cStack_7b;
                cVar45 = cStack_7a;
                bVar46 = bStack_79;
              }
              assignmentTarget = local_228;
              if (((&boost::unordered::detail::foa::
                     group15<boost::unordered::detail::foa::plain_integral>::
                     is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7] & bVar29) == 0) break;
              lVar22 = uVar23 + uVar28;
              uVar28 = uVar28 + 1;
              uVar23 = lVar22 + 1U & varMap._120_8_;
            } while (uVar28 <= (ulong)varMap._120_8_);
            if ((ulong)varMap._152_8_ < (ulong)varMap._144_8_) {
              boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Symbol_const*>,96ul,16ul>>
              ::
              unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&,slang::ast::PatternVarSymbol_const*&>
                        (&local_a0,
                         (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Symbol_const*>,96ul,16ul>>
                          *)&varMap.super_Storage.field_0x68,uVar30,hash,&local_269,sv,
                         (PatternVarSymbol **)&local_240);
            }
            else {
              boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Symbol_const*>,96ul,16ul>>
              ::
              unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&,slang::ast::PatternVarSymbol_const*&>
                        (&local_a0,
                         (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Symbol_const*>,96ul,16ul>>
                          *)&varMap.super_Storage.field_0x68,hash,&local_269,sv,
                         (PatternVarSymbol **)&local_240);
            }
            pTVar7 = trueContext.firstTempVar;
            uVar23 = local_248;
            trueContext.firstTempVar = local_240;
            local_240->nextTemp = pTVar7;
            DeclaredType::forceResolveAt
                      (&(local_240->super_VariableSymbol).super_ValueSymbol.declaredType,
                       &trueContext);
          }
LAB_003c4d53:
          context = local_258;
          syntax = local_220;
          ppPVar20 = (pointer)((long)local_260 + 8);
        }
        iVar11 = Pattern::bind((int)&trueContext,__addr,(socklen_t)pTVar25);
        pIVar14 = (InvalidPattern *)CONCAT44(extraout_var_00,iVar11);
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_96UL,_16UL>_>
        ::~table_core((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_96UL,_16UL>_>
                       *)&varMap.super_Storage.field_0x68);
      }
      else {
        varMap.super_Storage.buffer[0] = '\0';
        varMap.super_Storage.buffer[1] = '\0';
        varMap.super_Storage.buffer[2] = '\0';
        varMap.super_Storage.buffer[3] = '\0';
        varMap.super_Storage.buffer[4] = '\0';
        varMap.super_Storage.buffer[5] = '\0';
        varMap.super_Storage.buffer[6] = '\0';
        varMap.super_Storage.buffer[7] = '\0';
        __addr = (sockaddr *)&varMap;
        pIVar14 = BumpAllocator::emplace<slang::ast::InvalidPattern,decltype(nullptr)>
                            (&local_268->super_BumpAllocator,(void **)__addr);
      }
      SmallVectorBase<const_slang::ast::PatternVarSymbol_*>::cleanup
                (&vars.super_SmallVectorBase<const_slang::ast::PatternVarSymbol_*>,
                 (EVP_PKEY_CTX *)__addr);
      uVar23 = CONCAT71((int7)(uVar23 >> 8),(byte)uVar23 | (pIVar14->super_Pattern).kind == Invalid)
      ;
      isConst = false;
LAB_003c4e26:
      if (((uVar23 & 1) == 0) && (isConst == true)) {
        ASTContext::tryEval((ConstantValue *)&varMap,&trueContext,local_250);
        if ((varMap.super_Storage.buffer[0x20] == '\0') ||
           ((varMap.super_Storage.buffer[0x20] == '\x01' &&
            (pvVar15 = std::
                       get<1ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                                 ((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                   *)&varMap), (pvVar15->super_SVIntStorage).unknownFlag == true))))
        {
          isConst = false;
        }
        else {
          bVar8 = ConstantValue::isTrue((ConstantValue *)&varMap);
          if (!bVar8) {
            isTrue = false;
          }
        }
        std::__detail::__variant::
        _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                             *)&varMap);
      }
    }
    varMap.super_Storage.buffer._0_8_ = local_250;
    varMap.super_Storage.buffer._8_8_ = pIVar14;
    SmallVectorBase<slang::ast::ConditionalExpression::Condition>::
    emplace_back<slang::ast::ConditionalExpression::Condition>
              (&conditions.super_SmallVectorBase<slang::ast::ConditionalExpression::Condition>,
               (Condition *)&varMap);
  }
  uVar28 = 0;
  if (isConst != false) {
    uVar28 = (ulong)(((byte)~isTrue & 1) * 2);
  }
  uVar30 = (context->flags).m_bits & 0x600;
  bVar21.m_bits = uVar28 + 0x200;
  if (uVar30 != 0x600) {
    bVar21.m_bits = uVar28;
  }
  local_248 = uVar23;
  local_260 = Expression::create(local_268,(syntax->left).ptr,&trueContext,bVar21,assignmentTarget);
  uVar23 = (ulong)((uint)(byte)(bVar8 & bVar9) * 2);
  bVar21.m_bits = uVar23 + 0x200;
  if ((int)uVar30 != 0x600) {
    bVar21.m_bits = uVar23;
  }
  this_00 = Expression::create(pCVar6,(syntax->right).ptr,context,bVar21,local_228);
  bVar8 = Expression::bad(local_260);
  bVar9 = true;
  if (!bVar8) {
    bVar9 = Expression::bad(this_00);
  }
  pTVar25 = (local_260->type).ptr;
  this_02 = (this_00->type).ptr;
  bVar8 = Type::isUnbounded(pTVar25);
  pCVar6 = local_268;
  if (bVar8) {
    pTVar25 = local_268->intType;
  }
  bVar8 = Type::isUnbounded(this_02);
  if (bVar8) {
    this_02 = pCVar6->intType;
  }
  pTVar16 = OpInfo::binaryType(pCVar6,pTVar25,this_02,(bool)((byte)local_230 & 1),false);
  varMap.super_Storage.buffer._0_4_ =
       SmallVectorBase<slang::ast::ConditionalExpression::Condition>::copy
                 (&conditions.super_SmallVectorBase<slang::ast::ConditionalExpression::Condition>,
                  (EVP_PKEY_CTX *)pCVar6,src);
  varMap.super_Storage.buffer._4_4_ = extraout_var_01;
  local_238 = &syntax->question;
  local_a0.pg = (group15<boost::unordered::detail::foa::plain_integral> *)
                parsing::Token::location(local_238);
  vars.super_SmallVectorBase<const_slang::ast::PatternVarSymbol_*>._0_16_ =
       slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
  expr = BumpAllocator::
         emplace<slang::ast::ConditionalExpression,slang::ast::Type_const&,std::span<slang::ast::ConditionalExpression::Condition,18446744073709551615ul>,slang::SourceLocation,slang::ast::Expression&,slang::ast::Expression&,slang::SourceRange,bool&,bool&>
                   (&local_268->super_BumpAllocator,pTVar16,
                    (span<slang::ast::ConditionalExpression::Condition,_18446744073709551615UL> *)
                    &varMap,(SourceLocation *)&local_a0,local_260,this_00,(SourceRange *)&vars,
                    &isConst,&isTrue);
  if ((local_248 & 1) != 0 || bVar9 != false) {
    pCVar17 = (ConditionalExpression *)Expression::badExpr(local_268,&expr->super_Expression);
    ctx = expr;
    goto LAB_003c52ab;
  }
  bVar8 = Type::isNumeric(pTVar25);
  if ((!bVar8) || (bVar8 = Type::isNumeric(this_02), !bVar8)) {
    bVar8 = Type::isNull(pTVar25);
    if ((bVar8) && (bVar8 = Type::isNull(this_02), bVar8)) {
      pTVar16 = Compilation::getNullType(local_268);
    }
    else {
      bVar8 = Type::isClass(pTVar25);
      if ((((((bVar8) || (bVar8 = Type::isClass(this_02), bVar8)) ||
            (bVar8 = Type::isCHandle(pTVar25), bVar8)) ||
           (((bVar8 = Type::isCHandle(this_02), bVar8 || (bVar8 = Type::isEvent(pTVar25), bVar8)) ||
            (bVar8 = Type::isEvent(this_02), bVar8)))) ||
          ((bVar8 = Type::isVirtualInterface(pTVar25), bVar8 ||
           (bVar8 = Type::isVirtualInterface(this_02), bVar8)))) ||
         ((bVar8 = Type::isCovergroup(pTVar25), bVar8 ||
          (bVar8 = Type::isCovergroup(this_02), bVar8)))) {
        bVar8 = Type::isNull(pTVar25);
        pTVar16 = this_02;
        if (((((!bVar8) && (bVar8 = Type::isNull(this_02), pTVar16 = pTVar25, !bVar8)) &&
             (bVar8 = Type::isAssignmentCompatible(this_02,pTVar25), pTVar16 = this_02, !bVar8)) &&
            ((bVar8 = Type::isAssignmentCompatible(pTVar25,this_02), pTVar16 = pTVar25, !bVar8 &&
             (pTVar16 = Type::getCommonBase(pTVar25,this_02), this_01 = local_258,
             pTVar16 == (Type *)0x0)))) &&
           (bVar8 = Type::isEquivalent(pTVar25,this_02), pTVar16 = pTVar25, !bVar8)) {
LAB_003c531f:
          SVar18 = parsing::Token::location(local_238);
          pDVar13 = ASTContext::addDiag(this_01,(DiagCode)0x220007,SVar18);
          pDVar19 = ast::operator<<(pDVar13,pTVar25);
          ast::operator<<(pDVar19,this_02);
          Diagnostic::operator<<(pDVar13,local_260->sourceRange);
          Diagnostic::operator<<(pDVar13,this_00->sourceRange);
          pCVar17 = (ConditionalExpression *)Expression::badExpr(local_268,&expr->super_Expression);
          ctx = expr;
          goto LAB_003c52ab;
        }
      }
      else {
        bVar8 = Type::isEquivalent(pTVar25,this_02);
        pTVar16 = pTVar25;
        if (!bVar8) {
          bVar8 = Expression::isImplicitString(local_260);
          this_01 = local_258;
          if ((!bVar8) ||
             (bVar8 = Expression::isImplicitString(this_00), this_01 = local_258, !bVar8))
          goto LAB_003c531f;
          pTVar16 = local_268->stringType;
        }
      }
    }
    (expr->super_Expression).type.ptr = pTVar16;
  }
  if ((((conditions.super_SmallVectorBase<slang::ast::ConditionalExpression::Condition>.len == 1) &&
       ((conditions.super_SmallVectorBase<slang::ast::ConditionalExpression::Condition>.data_)->
        pattern == (Pattern *)0x0)) &&
      (this = ((conditions.super_SmallVectorBase<slang::ast::ConditionalExpression::Condition>.data_
               )->expr).ptr, this->kind == BinaryOp)) &&
     ((bVar8 = Expression::isParenthesized(this), !bVar8 &&
      ((bVar8 = OpInfo::isArithmetic(*(BinaryOperator *)&this[1].constant), bVar8 ||
       (bVar8 = OpInfo::isShift(*(BinaryOperator *)&this[1].constant), bVar8)))))) {
    arg = OpInfo::getText(*(BinaryOperator *)&this[1].constant);
    SVar18 = parsing::Token::location(local_238);
    pDVar13 = ASTContext::addDiag(local_258,(DiagCode)0xbc0007,SVar18);
    pDVar19 = Diagnostic::operator<<(pDVar13,arg);
    pDVar19 = Diagnostic::operator<<(pDVar19,arg);
    Diagnostic::operator<<(pDVar19,this->sourceRange);
    range.endLoc = (this_00->sourceRange).endLoc;
    range.startLoc = (SourceLocation)((this[1].type.ptr)->super_Symbol).parentScope;
    Diagnostic::addNote(pDVar13,(DiagCode)0xaf0007,range);
    pDVar13 = Diagnostic::addNote(pDVar13,(DiagCode)0xb30007,this->sourceRange);
    Diagnostic::operator<<(pDVar13,arg);
  }
  syntax_00._M_ptr =
       (local_220->attributes).
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  syntax_00._M_extent._M_extent_value =
       (local_220->attributes).
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
       _M_extent_value;
  ctx = expr;
  ASTContext::setAttributes(local_258,&expr->super_Expression,syntax_00);
  pCVar17 = expr;
LAB_003c52ab:
  SmallVectorBase<slang::ast::ConditionalExpression::Condition>::cleanup
            (&conditions.super_SmallVectorBase<slang::ast::ConditionalExpression::Condition>,
             (EVP_PKEY_CTX *)ctx);
  return &pCVar17->super_Expression;
}

Assistant:

Expression& ConditionalExpression::fromSyntax(Compilation& comp,
                                              const ConditionalExpressionSyntax& syntax,
                                              const ASTContext& context,
                                              const Type* assignmentTarget) {
    bool bad = false;
    bool isConst = true;
    bool isTrue = true;
    bool isFourState = false;
    SmallVector<Condition> conditions;
    ASTContext trueContext = context;

    for (auto condSyntax : syntax.predicate->conditions) {
        auto& cond = selfDetermined(comp, *condSyntax->expr, trueContext);
        bad |= cond.bad();

        const Pattern* pattern = nullptr;
        if (condSyntax->matchesClause) {
            pattern = createPattern(comp, trueContext, *condSyntax->matchesClause->pattern,
                                    *cond.type);
            bad |= pattern->bad();

            // We don't consider the condition to be const if there's a pattern.
            isConst = false;
        }
        else {
            isFourState |= cond.type->isFourState();
            if (!bad && !trueContext.requireBooleanConvertible(cond))
                bad = true;
        }

        if (!bad && isConst) {
            ConstantValue condVal = trueContext.tryEval(cond);
            if (!condVal || (condVal.isInteger() && condVal.integer().hasUnknown()))
                isConst = false;
            else if (!condVal.isTrue())
                isTrue = false;
        }

        conditions.push_back({&cond, pattern});
    }

    // If the predicate is known at compile time, we can tell which branch will be unevaluated.
    bitmask<ASTFlags> leftFlags = ASTFlags::None;
    bitmask<ASTFlags> rightFlags = ASTFlags::None;
    if (isConst) {
        if (isTrue)
            rightFlags = ASTFlags::UnevaluatedBranch;
        else
            leftFlags = ASTFlags::UnevaluatedBranch;
    }

    // Pass through the flag allowing unbounded literals.
    if (context.flags.has(ASTFlags::AllowUnboundedLiteral) &&
        context.flags.has(ASTFlags::AllowUnboundedLiteralArithmetic)) {
        leftFlags |= ASTFlags::AllowUnboundedLiteral;
        rightFlags |= ASTFlags::AllowUnboundedLiteral;
    }

    auto& left = create(comp, *syntax.left, trueContext, leftFlags, assignmentTarget);
    auto& right = create(comp, *syntax.right, context, rightFlags, assignmentTarget);
    bad |= left.bad() || right.bad();

    const Type* lt = left.type;
    const Type* rt = right.type;
    if (lt->isUnbounded())
        lt = &comp.getIntType();
    if (rt->isUnbounded())
        rt = &comp.getIntType();

    // Force four-state return type for ambiguous condition case.
    const Type* resultType = OpInfo::binaryType(comp, lt, rt, isFourState);
    auto result = comp.emplace<ConditionalExpression>(*resultType, conditions.copy(comp),
                                                      syntax.question.location(), left, right,
                                                      syntax.sourceRange(), isConst, isTrue);
    if (bad)
        return badExpr(comp, result);

    // If both sides of the expression are numeric, we've already determined the correct
    // result type. Otherwise, follow the rules in [11.14.11].
    bool good = true;
    if (!lt->isNumeric() || !rt->isNumeric()) {
        if (lt->isNull() && rt->isNull()) {
            result->type = &comp.getNullType();
        }
        else if (lt->isClass() || rt->isClass() || lt->isCHandle() || rt->isCHandle() ||
                 lt->isEvent() || rt->isEvent() || lt->isVirtualInterface() ||
                 rt->isVirtualInterface() || lt->isCovergroup() || rt->isCovergroup()) {
            if (lt->isNull())
                result->type = rt;
            else if (rt->isNull())
                result->type = lt;
            else if (rt->isAssignmentCompatible(*lt))
                result->type = rt;
            else if (lt->isAssignmentCompatible(*rt))
                result->type = lt;
            else if (auto common = Type::getCommonBase(*lt, *rt))
                result->type = common;
            else if (lt->isEquivalent(*rt))
                result->type = lt;
            else
                good = false;
        }
        else if (lt->isEquivalent(*rt)) {
            result->type = lt;
        }
        else if (left.isImplicitString() && right.isImplicitString()) {
            result->type = &comp.getStringType();
        }
        else {
            good = false;
        }
    }

    if (!good) {
        auto& diag = context.addDiag(diag::BadConditionalExpression, syntax.question.location());
        diag << *lt << *rt;
        diag << left.sourceRange;
        diag << right.sourceRange;
        return badExpr(comp, result);
    }

    // Warn about cases where a conditional expression and a binary operator
    // are mixed in a way that suggests the user mixed up the precedence order.
    // ex: `a + b ? 1 : 2`
    if (conditions.size() == 1 && !conditions[0].pattern) {
        if (auto binOp = conditions[0].expr->as_if<BinaryExpression>();
            binOp && !binOp->isParenthesized()) {
            if (OpInfo::isArithmetic(binOp->op) || OpInfo::isShift(binOp->op)) {
                auto opStr = OpInfo::getText(binOp->op);
                auto& diag = context.addDiag(diag::ConditionalPrecedence,
                                             syntax.question.location());
                diag << opStr << opStr << binOp->sourceRange;

                SourceRange range(binOp->right().sourceRange.start(), right.sourceRange.end());
                diag.addNote(diag::NoteConditionalPrecedenceFix, range);
                diag.addNote(diag::NotePrecedenceSilence, binOp->sourceRange) << opStr;
            }
        }
    }

    context.setAttributes(*result, syntax.attributes);
    return *result;
}